

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O0

void __thiscall
duckdb::CSVSniffer::CSVSniffer
          (CSVSniffer *this,CSVReaderOptions *options_p,MultiFileOptions *file_options,
          shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager_p,
          CSVStateMachineCache *state_machine_cache_p,bool default_null_to_varchar_p)

{
  initializer_list<const_char_*> iVar1;
  initializer_list<const_char_*> iVar2;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_> __l
  ;
  bool bVar3;
  shared_ptr<duckdb::CSVErrorHandler,_true> *other;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
  *this_00;
  undefined8 in_R8;
  byte in_R9B;
  LogicalTypeId *logical_type;
  pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_> *format_template;
  const_iterator __end1;
  const_iterator __begin1;
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  *__range1;
  SetColumns *in_stack_fffffffffffffd28;
  pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_> *in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  shared_ptr<duckdb::CSVErrorHandler,_true> *in_stack_fffffffffffffd40;
  CSVError *in_stack_fffffffffffffd50;
  bool *in_stack_fffffffffffffd58;
  mapped_type *in_stack_fffffffffffffd68;
  allocator_type *in_stack_fffffffffffffd70;
  less<duckdb::LogicalTypeId> *in_stack_fffffffffffffd78;
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  *in_stack_fffffffffffffd80;
  iterator in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd90;
  undefined1 **local_238;
  SetColumns local_1d0;
  undefined1 local_1b9;
  reference local_198;
  reference local_190;
  _Self local_188;
  _Self local_180;
  undefined1 *local_178;
  undefined1 local_16a;
  char *local_168;
  char *pcStack_160;
  char *local_158;
  char *pcStack_150;
  char *local_148;
  char *pcStack_140;
  char *local_138;
  char **local_128;
  undefined8 local_120;
  undefined1 local_fa;
  char *local_f8;
  char *pcStack_f0;
  char *local_e8;
  char *pcStack_e0;
  char *local_d8;
  char *pcStack_d0;
  char **local_c8;
  undefined8 local_c0;
  undefined1 local_99;
  undefined8 *local_98;
  undefined1 *local_90 [4];
  undefined1 local_70 [32];
  undefined8 *local_50;
  undefined8 local_48;
  byte local_29;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_29 = in_R9B & 1;
  *in_RDI = 1;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CSVError::CSVError(in_stack_fffffffffffffd50);
  *(undefined8 *)(in_RDI + 0x98) = local_28;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
            *)0x1768818);
  *(undefined8 *)(in_RDI + 200) = local_10;
  *(undefined8 *)(in_RDI + 0xd0) = local_18;
  shared_ptr<duckdb::CSVBufferManager,_true>::shared_ptr
            ((shared_ptr<duckdb::CSVBufferManager,_true> *)in_stack_fffffffffffffd30,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)in_stack_fffffffffffffd28);
  SetColumns::SetColumns((SetColumns *)(in_RDI + 0xe8));
  shared_ptr<duckdb::CSVErrorHandler,_true>::shared_ptr
            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)0x176888e);
  shared_ptr<duckdb::CSVErrorHandler,_true>::shared_ptr
            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)0x17688ac);
  *(undefined8 *)(in_RDI + 0x118) = 0;
  local_16a = 1;
  local_98 = local_90;
  local_99 = 0xf;
  local_d8 = "%Y-%m-%d";
  pcStack_d0 = "%y-%m-%d";
  local_e8 = "%d-%m-%Y";
  pcStack_e0 = "%d-%m-%y";
  local_f8 = "%m-%d-%Y";
  pcStack_f0 = "%m-%d-%y";
  local_c8 = &local_f8;
  local_c0 = 6;
  ::std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x176894d);
  iVar1._M_len = (size_type)in_stack_fffffffffffffd40;
  iVar1._M_array = in_stack_fffffffffffffd38;
  vector<const_char_*,_true>::vector
            ((vector<const_char_*,_true> *)in_stack_fffffffffffffd30,iVar1,
             (allocator_type *)in_stack_fffffffffffffd28);
  ::std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>::
  pair<duckdb::LogicalTypeId,_true>
            (in_stack_fffffffffffffd30,(LogicalTypeId *)in_stack_fffffffffffffd28,
             (vector<const_char_*,_true> *)0x1768991);
  local_98 = (undefined8 *)local_70;
  local_fa = 0x13;
  local_138 = "%y-%m-%d %H:%M:%S";
  local_148 = "%d-%m-%y %H:%M:%S";
  pcStack_140 = "%Y-%m-%d %H:%M:%S";
  local_158 = "%m-%d-%y %I:%M:%S %p";
  pcStack_150 = "%d-%m-%Y %H:%M:%S";
  local_168 = "%Y-%m-%d %H:%M:%S.%f";
  pcStack_160 = "%m-%d-%Y %I:%M:%S %p";
  local_128 = &local_168;
  local_120 = 7;
  ::std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1768a20);
  iVar2._M_len = (size_type)in_stack_fffffffffffffd40;
  iVar2._M_array = in_stack_fffffffffffffd38;
  vector<const_char_*,_true>::vector
            ((vector<const_char_*,_true> *)in_stack_fffffffffffffd30,iVar2,
             (allocator_type *)in_stack_fffffffffffffd28);
  ::std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>::
  pair<duckdb::LogicalTypeId,_true>
            (in_stack_fffffffffffffd30,(LogicalTypeId *)in_stack_fffffffffffffd28,
             (vector<const_char_*,_true> *)0x1768a64);
  local_16a = 0;
  local_50 = local_90;
  local_48 = 2;
  ::std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>::
  allocator((allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
             *)0x1768a9f);
  __l._M_len = in_stack_fffffffffffffd90;
  __l._M_array = in_stack_fffffffffffffd88;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  ::map(in_stack_fffffffffffffd80,__l,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  ::std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>::
  ~allocator((allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
              *)0x1768adb);
  local_238 = (undefined1 **)&local_50;
  do {
    local_238 = local_238 + -4;
    ::std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>::~pair
              ((pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_> *)0x1768b10);
  } while (local_238 != local_90);
  vector<const_char_*,_true>::~vector((vector<const_char_*,_true> *)0x1768b3a);
  ::std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1768b47);
  vector<const_char_*,_true>::~vector((vector<const_char_*,_true> *)0x1768b54);
  ::std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1768b61);
  this_00 = (map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
             *)(in_RDI + 0x150);
  ::std::
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                   *)0x1768b7a);
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
  ::map((map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
         *)0x1768b93);
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>::
  unique_ptr((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              *)0x1768bac);
  vector<duckdb::HeaderValue,_true>::vector((vector<duckdb::HeaderValue,_true> *)0x1768bc5);
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  ::map((map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
         *)0x1768bde);
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  ::map((map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
         *)0x1768bf7);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1768c10);
  in_RDI[0x250] = local_29 & 1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x1768c3b);
  in_RDI[0x270] = 0;
  vector<bool,_true>::vector((vector<bool,_true> *)0x1768c5e);
  local_178 = in_RDI + 0x120;
  local_180._M_node =
       (_Base_ptr)
       ::std::
       map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
       ::begin((map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
                *)in_stack_fffffffffffffd28);
  local_188._M_node =
       (_Base_ptr)
       ::std::
       map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
       ::end((map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
              *)in_stack_fffffffffffffd28);
  while( true ) {
    bVar3 = ::std::operator!=(&local_180,&local_188);
    if (!bVar3) break;
    local_198 = ::std::
                _Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
                ::operator*((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
                             *)0x1768cc9);
    local_190 = local_198;
    in_stack_fffffffffffffd68 =
         ::std::
         map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
         ::operator[](this_00,(key_type *)in_stack_fffffffffffffd68);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x1768d0e);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
                  *)in_stack_fffffffffffffd30);
  }
  other = (shared_ptr<duckdb::CSVErrorHandler,_true> *)SetColumns::Size(in_stack_fffffffffffffd28);
  *(shared_ptr<duckdb::CSVErrorHandler,_true> **)(in_RDI + 0xa0) = other;
  CSVOption<bool>::GetValue((CSVOption<bool> *)(*(long *)(in_RDI + 200) + 0x90));
  make_shared_ptr<duckdb::CSVErrorHandler,bool_const&>(in_stack_fffffffffffffd58);
  shared_ptr<duckdb::CSVErrorHandler,_true>::operator=(in_stack_fffffffffffffd40,other);
  shared_ptr<duckdb::CSVErrorHandler,_true>::~shared_ptr
            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)0x1768fc0);
  local_1b9 = 1;
  make_shared_ptr<duckdb::CSVErrorHandler,bool>(in_stack_fffffffffffffd58);
  shared_ptr<duckdb::CSVErrorHandler,_true>::operator=(in_stack_fffffffffffffd40,other);
  shared_ptr<duckdb::CSVErrorHandler,_true>::~shared_ptr
            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)0x1769008);
  if ((*(byte *)(*(long *)(in_RDI + 200) + 0x180) & 1) != 0) {
    SetColumns::SetColumns
              (&local_1d0,(vector<duckdb::LogicalType,_true> *)(*(long *)(in_RDI + 200) + 0x150),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(*(long *)(in_RDI + 200) + 0x168));
    *(vector<duckdb::LogicalType,_true> **)(in_RDI + 0xe8) = local_1d0.types;
    *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      **)(in_RDI + 0xf0) = local_1d0.names;
  }
  return;
}

Assistant:

CSVSniffer::CSVSniffer(CSVReaderOptions &options_p, const MultiFileOptions &file_options,
                       shared_ptr<CSVBufferManager> buffer_manager_p, CSVStateMachineCache &state_machine_cache_p,
                       bool default_null_to_varchar_p)
    : state_machine_cache(state_machine_cache_p), options(options_p), file_options(file_options),
      buffer_manager(std::move(buffer_manager_p)), lines_sniffed(0),
      default_null_to_varchar(default_null_to_varchar_p) {
	// Initialize Format Candidates
	for (const auto &format_template : format_template_candidates) {
		auto &logical_type = format_template.first;
		best_format_candidates[logical_type].clear();
	}
	// Initialize max columns found to either 0 or however many were set
	max_columns_found = set_columns.Size();
	error_handler = make_shared_ptr<CSVErrorHandler>(options.ignore_errors.GetValue());
	detection_error_handler = make_shared_ptr<CSVErrorHandler>(true);
	if (options.columns_set) {
		set_columns = SetColumns(&options.sql_type_list, &options.name_list);
	}
}